

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void start_corpse_timeout(obj *body)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  monst *pmVar4;
  monst *mtmp;
  long age;
  short action;
  int rot_adjust;
  long corpse_age;
  long when;
  obj *body_local;
  
  if ((body->corpsenm != 0x154) && (body->corpsenm != 0xa3)) {
    age._2_2_ = 1;
    iVar2 = 10;
    if (in_mklev != '\0') {
      iVar2 = 0x19;
    }
    uVar3 = (ulong)(moves - body->age);
    if (uVar3 < 0xfb) {
      corpse_age = 0xfa - uVar3;
    }
    else {
      corpse_age = (long)iVar2;
    }
    iVar1 = rnz(iVar2);
    corpse_age = (iVar1 - iVar2) + corpse_age;
    if (((((long)body->corpsenm & 0x3ffffffffffffffU) == 0x144) ||
        (((long)body->corpsenm & 0x3ffffffffffffffU) == 0x146)) ||
       (((long)body->corpsenm & 0x3ffffffffffffffU) == 0x145)) {
      age._2_2_ = 2;
      corpse_age = 0xc;
      while ((corpse_age < 500 && (iVar2 = rn2(3), iVar2 != 0))) {
        corpse_age = corpse_age + 1;
      }
    }
    else if ((((*(uint *)&body->field_0x4a >> 10 & 3) == 0) &&
             ((((mons[body->corpsenm].mlet == '4' &&
                (((long)body->corpsenm & 0x3ffffffffffffffU) != 0xfd)) &&
               ((((long)body->corpsenm & 0x3ffffffffffffffU) != 0xfe &&
                ((urole.malenum != 0x161 || (iVar2 = rn2(2), iVar2 != 0)))))) ||
              (mons[body->corpsenm].mlet == '.')))) &&
            ((pmVar4 = get_mtraits(body,'\0'), pmVar4 != (monst *)0x0 &&
             ((*(uint *)&pmVar4->field_0x60 >> 8 & 1) == 0)))) {
      for (mtmp = (monst *)0x2; (long)mtmp < 0x33; mtmp = (monst *)((long)&mtmp->nmon + 1)) {
        iVar2 = rn2(0x25);
        if (iVar2 == 0) {
          age._2_2_ = 2;
          corpse_age = (long)mtmp;
          break;
        }
      }
    }
    if ((*(uint *)&body->field_0x4a >> 10 & 3) != 0) {
      *(uint *)&body->field_0x4a = *(uint *)&body->field_0x4a & 0xfffff3ff;
    }
    start_timer(body->olev,corpse_age,2,age._2_2_,body);
  }
  return;
}

Assistant:

void start_corpse_timeout(struct obj *body)
{
	long when; 		/* rot away when this old */
	long corpse_age;	/* age of corpse          */
	int rot_adjust;
	short action;

#define TAINT_AGE (50L)		/* age when corpses go bad */
#define REVIVE_CHANCE 37	/* 1/37 chance for 50 turns ~ 75% chance */
#define ROT_AGE (250L)		/* age when corpses rot away */

	/* lizards and lichen don't rot or revive */
	if (body->corpsenm == PM_LIZARD || body->corpsenm == PM_LICHEN) return;

	action = ROT_CORPSE;		/* default action: rot away */
	rot_adjust = in_mklev ? 25 : 10;	/* give some variation */
	corpse_age = moves - body->age;
	if (corpse_age > ROT_AGE)
		when = rot_adjust;
	else
		when = ROT_AGE - corpse_age;
	when += (long)(rnz(rot_adjust) - rot_adjust);

	if (is_rider(&mons[body->corpsenm])) {
		/*
		 * Riders always revive.  They have a 1/3 chance per turn
		 * of reviving after 12 turns.  Always revive by 500.
		 */
		action = REVIVE_MON;
		for (when = 12L; when < 500L; when++)
		    if (!rn2(3)) break;

	} else if (!body->norevive &&
		   ((is_zombie(&mons[body->corpsenm]) &&
		     /* Priests have a chance to put down zombies for good. */
		     !(Role_if(PM_PRIEST) && !rn2(2))) ||
		    mons[body->corpsenm].mlet == S_TROLL)) {
		long age;
		struct monst *mtmp = get_mtraits(body, FALSE);
		if (mtmp && !mtmp->mcan) {
		    for (age = 2; age <= TAINT_AGE; age++) {
			if (!rn2(REVIVE_CHANCE)) {	/* monster revives */
			    action = REVIVE_MON;
			    when = age;
			    break;
			}
		    }
		}
	}

	if (body->norevive) body->norevive = 0;
	start_timer(body->olev, when, TIMER_OBJECT, action, body);
}